

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O0

CURLcode post_per_transfer(GlobalConfig *global,per_transfer *per,CURLcode result,_Bool *retryp)

{
  GlobalConfig *config_00;
  per_transfer *ppVar1;
  char *pcVar2;
  OperationConfig *curl_00;
  CURLcode CVar3;
  _Bool _Var4;
  int iVar5;
  int *piVar6;
  char *pcVar7;
  long lVar8;
  undefined8 uVar9;
  char *local_e8;
  curl_off_t local_d0;
  curl_off_t filetime;
  long lStack_c0;
  int rc_3;
  char *effective_url;
  long response_1;
  long lStack_a8;
  int rc_2;
  curl_off_t retry_after;
  long sleeptime;
  long protocol_1;
  long protocol;
  long oserrno;
  long response;
  undefined1 auStack_70 [4];
  anon_enum_32 retry;
  int local_5c;
  long lStack_58;
  int rc_1;
  long cond_unmet;
  OperationConfig *pOStack_48;
  int rc;
  OperationConfig *config;
  CURL *curl;
  OutStruct *outs;
  _Bool *retryp_local;
  per_transfer *ppStack_20;
  CURLcode result_local;
  per_transfer *per_local;
  GlobalConfig *global_local;
  
  curl = (CURL *)&per->outs;
  config = (OperationConfig *)per->curl;
  pOStack_48 = per->config;
  if (config == (OperationConfig *)0x0) {
    return result;
  }
  if (pOStack_48 == (OperationConfig *)0x0) {
    return result;
  }
  *retryp = false;
  outs = (OutStruct *)retryp;
  retryp_local._4_4_ = result;
  ppStack_20 = per;
  per_local = (per_transfer *)global;
  if ((per->infdopen & 1U) != 0) {
    close(per->infd);
  }
  CVar3 = retryp_local._4_4_;
  if (((pOStack_48->synthetic_error == ERR_NONE) && (retryp_local._4_4_ != CURLE_OK)) &&
     (*(int *)&per_local->next != 0)) {
    ppVar1 = per_local->prev;
    if (ppStack_20->errorbuffer[0] == '\0') {
      local_e8 = (char *)curl_easy_strerror(retryp_local._4_4_);
    }
    else {
      local_e8 = ppStack_20->errorbuffer;
    }
    curl_mfprintf(ppVar1,"curl: (%d) %s\n",CVar3,local_e8);
    if (retryp_local._4_4_ == CURLE_PEER_FAILED_VERIFICATION) {
      fputs("More details here: https://curl.haxx.se/docs/sslcerts.html\n\ncurl failed to verify the legitimacy of the server and therefore could not\nestablish a secure connection to it. To learn more about this situation and\nhow to fix it, please visit the web page mentioned above.\n"
            ,(FILE *)per_local->prev);
    }
  }
  curl_00 = config;
  if (((retryp_local._4_4_ == CURLE_OK) && ((pOStack_48->xattr & 1U) != 0)) &&
     ((((byte)curl[0xb] & 1) != 0 && (*(long *)(curl + 0x10) != 0)))) {
    iVar5 = fileno(*(FILE **)(curl + 0x10));
    cond_unmet._4_4_ = fwrite_xattr((CURL *)curl_00,iVar5);
    if (cond_unmet._4_4_ != 0) {
      config_00 = pOStack_48->global;
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      warnf(config_00,"Error setting extended attributes: %s\n",pcVar7);
    }
  }
  if (((retryp_local._4_4_ == CURLE_OK) && (*(long *)(curl + 0x10) == 0)) &&
     (*(long *)(curl + 0x18) == 0)) {
    lStack_58 = 0;
    curl_easy_getinfo(config,0x200023,&stack0xffffffffffffffa8);
    if ((lStack_58 == 0) && (_Var4 = tool_create_output_file((OutStruct *)curl,pOStack_48), !_Var4))
    {
      retryp_local._4_4_ = CURLE_WRITE_ERROR;
    }
  }
  if ((((((byte)curl[10] & 1) == 0) && (*(long *)(curl + 0x10) != 0)) &&
      (local_5c = fflush(*(FILE **)(curl + 0x10)), retryp_local._4_4_ == CURLE_OK)) &&
     (local_5c != 0)) {
    retryp_local._4_4_ = CURLE_WRITE_ERROR;
    curl_mfprintf(per_local->prev,"(%d) Failed writing body\n",0x17);
  }
  if (((((byte)curl[9] & 1) != 0) && (*(long *)(curl + 0x10) != 0)) &&
     ((((ulong)per_local->next & 0x100000000) == 0 && (*(long *)curl != 0)))) {
    curl_mprintf("curl: Saved to filename \'%s\'\n",*(undefined8 *)curl);
  }
  if (ppStack_20->retry_numretries == 0) {
LAB_001188d2:
    if ((ppStack_20->metalink & 1U) != 0) {
      if (retryp_local._4_4_ == CURLE_OK) {
        lStack_c0 = 0;
        curl_easy_getinfo(config,0x100001,&stack0xffffffffffffff40);
        if (((lStack_c0 != 0) && (iVar5 = curl_strnequal(lStack_c0,"http",4), iVar5 != 0)) &&
           ((curl_easy_getinfo(config,0x200002,&effective_url), effective_url != (char *)0xc8 &&
            (effective_url != (char *)0xce)))) {
          ppStack_20->metalink_next_res = true;
          curl_mfprintf(per_local->prev,
                        "Metalink: fetching (%s) from (%s) FAILED (HTTP status code %ld)\n",
                        ppStack_20->mlfile->filename,ppStack_20->this_url,effective_url);
        }
      }
      else {
        ppStack_20->metalink_next_res = true;
        ppVar1 = per_local->prev;
        pcVar7 = ppStack_20->mlfile->filename;
        pcVar2 = ppStack_20->this_url;
        uVar9 = curl_easy_strerror(retryp_local._4_4_);
        curl_mfprintf(ppVar1,"Metalink: fetching (%s) from (%s) FAILED (%s)\n",pcVar7,pcVar2,uVar9);
      }
    }
  }
  else {
    if (pOStack_48->retry_maxtime != 0) {
      _auStack_70 = tvnow();
      lVar8 = tvdiff(_auStack_70,ppStack_20->retrystart);
      if (SBORROW8(lVar8,pOStack_48->retry_maxtime * 1000) ==
          lVar8 + pOStack_48->retry_maxtime * -1000 < 0) goto LAB_001188d2;
    }
    response._4_4_ = 0;
    if ((((retryp_local._4_4_ == CURLE_OPERATION_TIMEDOUT) ||
         (retryp_local._4_4_ == CURLE_COULDNT_RESOLVE_HOST)) ||
        (retryp_local._4_4_ == CURLE_COULDNT_RESOLVE_PROXY)) ||
       (retryp_local._4_4_ == CURLE_FTP_ACCEPT_TIMEOUT)) {
      response._4_4_ = 1;
    }
    else if (((pOStack_48->retry_connrefused & 1U) == 0) ||
            (retryp_local._4_4_ != CURLE_COULDNT_CONNECT)) {
      if ((retryp_local._4_4_ == CURLE_OK) ||
         (((pOStack_48->failonerror & 1U) != 0 && (retryp_local._4_4_ == CURLE_HTTP_RETURNED_ERROR))
         )) {
        curl_easy_getinfo(config,0x200030,&protocol_1);
        if (((protocol_1 == 1) || (protocol_1 == 2)) &&
           (((curl_easy_getinfo(config,0x200002,&oserrno), oserrno == 0x1ad || (oserrno == 500)) ||
            (oserrno - 0x1f6U < 3)))) {
          response._4_4_ = 3;
        }
      }
      else if (retryp_local._4_4_ != CURLE_OK) {
        curl_easy_getinfo(config,0x200002,&oserrno);
        curl_easy_getinfo(config,0x200030,&sleeptime);
        if (((sleeptime == 4) || (sleeptime == 8)) && (oserrno / 100 == 4)) {
          response._4_4_ = 4;
        }
      }
    }
    else {
      curl_easy_getinfo(config,0x200019,&protocol);
      if (protocol == 0x6f) {
        response._4_4_ = 2;
      }
    }
    if (response._4_4_ != 0) {
      lStack_a8 = 0;
      retry_after = ppStack_20->retry_sleep;
      if ((response._4_4_ == 3) &&
         (curl_easy_getinfo(config,0x600039,&stack0xffffffffffffff58), lStack_a8 != 0)) {
        if (lStack_a8 < 0x20c49ba5e353f8) {
          retry_after = lStack_a8 * 1000;
        }
        else {
          retry_after = 0x7fffffffffffffff;
        }
      }
      warnf(pOStack_48->global,
            "Transient problem: %s Will retry in %ld seconds. %ld retries left.\n",
            post_per_transfer::m[response._4_4_],retry_after / 1000,ppStack_20->retry_numretries);
      ppStack_20->retry_numretries = ppStack_20->retry_numretries + -1;
      tool_go_sleep(retry_after);
      if ((pOStack_48->retry_delay == 0) &&
         (ppStack_20->retry_sleep = ppStack_20->retry_sleep << 1, 600000 < ppStack_20->retry_sleep))
      {
        ppStack_20->retry_sleep = 600000;
      }
      if (((*(long *)(curl + 0x18) != 0) && (*(long *)curl != 0)) && (*(long *)(curl + 0x10) != 0))
      {
        if (((ulong)per_local->next & 0x100000000) == 0) {
          curl_mfprintf(per_local->prev,"Throwing away %ld bytes\n",*(undefined8 *)(curl + 0x18));
        }
        fflush(*(FILE **)(curl + 0x10));
        iVar5 = fileno(*(FILE **)(curl + 0x10));
        iVar5 = ftruncate64(iVar5,*(__off64_t *)(curl + 0x20));
        if (iVar5 != 0) {
          if (((ulong)per_local->next & 0x100000000) == 0) {
            curl_mfprintf(per_local->prev,"failed to truncate, exiting\n");
          }
          return CURLE_WRITE_ERROR;
        }
        response_1._4_4_ = fseek(*(FILE **)(curl + 0x10),0,2);
        if (response_1._4_4_ != 0) {
          if (((ulong)per_local->next & 0x100000000) == 0) {
            curl_mfprintf(per_local->prev,"failed seeking to end of file, exiting\n");
          }
          return CURLE_WRITE_ERROR;
        }
        *(undefined8 *)(curl + 0x18) = 0;
      }
      *(undefined1 *)&outs->filename = 1;
      return CURLE_OK;
    }
  }
  if ((*(int *)((long)&per_local->retry_sleep + 4) == 1) && ((ppStack_20->progressbar).calls != 0))
  {
    fputs("\n",(FILE *)(ppStack_20->progressbar).out);
  }
  if (pOStack_48->writeout != (char *)0x0) {
    ourWriteOut(ppStack_20->curl,&ppStack_20->outs,pOStack_48->writeout);
  }
  if (((((byte)curl[0xb] & 1) != 0) && (*(long *)(curl + 0x10) != 0)) &&
     ((filetime._4_4_ = fclose(*(FILE **)(curl + 0x10)), retryp_local._4_4_ == CURLE_OK &&
      (filetime._4_4_ != 0)))) {
    retryp_local._4_4_ = CURLE_WRITE_ERROR;
    curl_mfprintf(per_local->prev,"(%d) Failed writing body\n",0x17);
  }
  if ((((retryp_local._4_4_ == CURLE_OK) && ((pOStack_48->remote_time & 1U) != 0)) &&
      (((byte)curl[10] & 1) != 0)) && (*(long *)curl != 0)) {
    local_d0 = -1;
    curl_easy_getinfo(config,0x60000e,&local_d0);
    setfiletime(local_d0,*(char **)curl,pOStack_48->global->errors);
  }
  if ((((ppStack_20->heads).fopened & 1U) != 0) && ((ppStack_20->heads).stream != (FILE *)0x0)) {
    fclose((FILE *)(ppStack_20->heads).stream);
  }
  if (((ppStack_20->heads).alloc_filename & 1U) != 0) {
    free((ppStack_20->heads).filename);
    (ppStack_20->heads).filename = (char *)0x0;
  }
  if ((((ppStack_20->etag_save).fopened & 1U) != 0) &&
     ((ppStack_20->etag_save).stream != (FILE *)0x0)) {
    fclose((FILE *)(ppStack_20->etag_save).stream);
  }
  if (((ppStack_20->etag_save).alloc_filename & 1U) != 0) {
    free((ppStack_20->etag_save).filename);
    (ppStack_20->etag_save).filename = (char *)0x0;
  }
  curl_easy_cleanup(ppStack_20->curl);
  if (((byte)curl[8] & 1) != 0) {
    free(*(void **)curl);
  }
  free(ppStack_20->this_url);
  free(ppStack_20->separator_err);
  free(ppStack_20->separator);
  free(ppStack_20->outfile);
  free(ppStack_20->uploadfile);
  return CURLE_OK;
}

Assistant:

static CURLcode post_per_transfer(struct GlobalConfig *global,
                                  struct per_transfer *per,
                                  CURLcode result,
                                  bool *retryp)
{
  struct OutStruct *outs = &per->outs;
  CURL *curl = per->curl;
  struct OperationConfig *config = per->config;

  if(!curl || !config)
    return result;

  *retryp = FALSE;

  if(per->infdopen)
    close(per->infd);

#ifdef __VMS
  if(is_vms_shell()) {
    /* VMS DCL shell behavior */
    if(!global->showerror)
      vms_show = VMSSTS_HIDE;
  }
  else
#endif
    if(config->synthetic_error) {
      ;
    }
    else if(result && global->showerror) {
      fprintf(global->errors, "curl: (%d) %s\n", result,
              (per->errorbuffer[0]) ? per->errorbuffer :
              curl_easy_strerror(result));
      if(result == CURLE_PEER_FAILED_VERIFICATION)
        fputs(CURL_CA_CERT_ERRORMSG, global->errors);
    }

  /* Set file extended attributes */
  if(!result && config->xattr && outs->fopened && outs->stream) {
    int rc = fwrite_xattr(curl, fileno(outs->stream));
    if(rc)
      warnf(config->global, "Error setting extended attributes: %s\n",
            strerror(errno));
  }

  if(!result && !outs->stream && !outs->bytes) {
    /* we have received no data despite the transfer was successful
       ==> force cration of an empty output file (if an output file
       was specified) */
    long cond_unmet = 0L;
    /* do not create (or even overwrite) the file in case we get no
       data because of unmet condition */
    curl_easy_getinfo(curl, CURLINFO_CONDITION_UNMET, &cond_unmet);
    if(!cond_unmet && !tool_create_output_file(outs, config))
      result = CURLE_WRITE_ERROR;
  }

  if(!outs->s_isreg && outs->stream) {
    /* Dump standard stream buffered data */
    int rc = fflush(outs->stream);
    if(!result && rc) {
      /* something went wrong in the writing process */
      result = CURLE_WRITE_ERROR;
      fprintf(global->errors, "(%d) Failed writing body\n", result);
    }
  }

#ifdef USE_METALINK
  if(per->metalink && !per->metalink_next_res)
    fprintf(global->errors, "Metalink: fetching (%s) from (%s) OK\n",
            per->mlfile->filename, per->this_url);

  if(!per->metalink && config->use_metalink && result == CURLE_OK) {
    int rv = parse_metalink(config, outs, per->this_url);
    if(!rv) {
      fprintf(config->global->errors, "Metalink: parsing (%s) OK\n",
              per->this_url);
    }
    else if(rv == -1)
      fprintf(config->global->errors, "Metalink: parsing (%s) FAILED\n",
              per->this_url);
  }
  else if(per->metalink && result == CURLE_OK && !per->metalink_next_res) {
    int rv;
    (void)fflush(outs->stream);
    rv = metalink_check_hash(global, per->mlfile, outs->filename);
    if(!rv)
      per->metalink_next_res = 1;
  }
#endif /* USE_METALINK */

#ifdef USE_METALINK
  if(outs->metalink_parser)
    metalink_parser_context_delete(outs->metalink_parser);
#endif /* USE_METALINK */

  if(outs->is_cd_filename && outs->stream && !global->mute &&
     outs->filename)
    printf("curl: Saved to filename '%s'\n", outs->filename);

  /* if retry-max-time is non-zero, make sure we haven't exceeded the
     time */
  if(per->retry_numretries &&
     (!config->retry_maxtime ||
      (tvdiff(tvnow(), per->retrystart) <
       config->retry_maxtime*1000L)) ) {
    enum {
      RETRY_NO,
      RETRY_TIMEOUT,
      RETRY_CONNREFUSED,
      RETRY_HTTP,
      RETRY_FTP,
      RETRY_LAST /* not used */
    } retry = RETRY_NO;
    long response;
    if((CURLE_OPERATION_TIMEDOUT == result) ||
       (CURLE_COULDNT_RESOLVE_HOST == result) ||
       (CURLE_COULDNT_RESOLVE_PROXY == result) ||
       (CURLE_FTP_ACCEPT_TIMEOUT == result))
      /* retry timeout always */
      retry = RETRY_TIMEOUT;
    else if(config->retry_connrefused &&
            (CURLE_COULDNT_CONNECT == result)) {
      long oserrno;
      curl_easy_getinfo(curl, CURLINFO_OS_ERRNO, &oserrno);
      if(ECONNREFUSED == oserrno)
        retry = RETRY_CONNREFUSED;
    }
    else if((CURLE_OK == result) ||
            (config->failonerror &&
             (CURLE_HTTP_RETURNED_ERROR == result))) {
      /* If it returned OK. _or_ failonerror was enabled and it
         returned due to such an error, check for HTTP transient
         errors to retry on. */
      long protocol;
      curl_easy_getinfo(curl, CURLINFO_PROTOCOL, &protocol);
      if((protocol == CURLPROTO_HTTP) || (protocol == CURLPROTO_HTTPS)) {
        /* This was HTTP(S) */
        curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &response);

        switch(response) {
        case 429: /* Too Many Requests (RFC6585) */
        case 500: /* Internal Server Error */
        case 502: /* Bad Gateway */
        case 503: /* Service Unavailable */
        case 504: /* Gateway Timeout */
          retry = RETRY_HTTP;
          /*
           * At this point, we have already written data to the output
           * file (or terminal). If we write to a file, we must rewind
           * or close/re-open the file so that the next attempt starts
           * over from the beginning.
           *
           * TODO: similar action for the upload case. We might need
           * to start over reading from a previous point if we have
           * uploaded something when this was returned.
           */
          break;
        }
      }
    } /* if CURLE_OK */
    else if(result) {
      long protocol;

      curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &response);
      curl_easy_getinfo(curl, CURLINFO_PROTOCOL, &protocol);

      if((protocol == CURLPROTO_FTP || protocol == CURLPROTO_FTPS) &&
         response / 100 == 4)
        /*
         * This is typically when the FTP server only allows a certain
         * amount of users and we are not one of them.  All 4xx codes
         * are transient.
         */
        retry = RETRY_FTP;
    }

    if(retry) {
      long sleeptime = 0;
      curl_off_t retry_after = 0;
      static const char * const m[]={
        NULL,
        "timeout",
        "connection refused",
        "HTTP error",
        "FTP error"
      };

      sleeptime = per->retry_sleep;
      if(RETRY_HTTP == retry) {
        curl_easy_getinfo(curl, CURLINFO_RETRY_AFTER, &retry_after);
        if(retry_after) {
          /* store in a 'long', make sure it doesn't overflow */
          if(retry_after > LONG_MAX/1000)
            sleeptime = LONG_MAX;
          else
            sleeptime = (long)retry_after * 1000; /* milliseconds */
        }
      }
      warnf(config->global, "Transient problem: %s "
            "Will retry in %ld seconds. "
            "%ld retries left.\n",
            m[retry], sleeptime/1000L, per->retry_numretries);

      per->retry_numretries--;
      tool_go_sleep(sleeptime);
      if(!config->retry_delay) {
        per->retry_sleep *= 2;
        if(per->retry_sleep > RETRY_SLEEP_MAX)
          per->retry_sleep = RETRY_SLEEP_MAX;
      }
      if(outs->bytes && outs->filename && outs->stream) {
        int rc;
        /* We have written data to a output file, we truncate file
         */
        if(!global->mute)
          fprintf(global->errors, "Throwing away %"
                  CURL_FORMAT_CURL_OFF_T " bytes\n",
                  outs->bytes);
        fflush(outs->stream);
        /* truncate file at the position where we started appending */
#ifdef HAVE_FTRUNCATE
        if(ftruncate(fileno(outs->stream), outs->init)) {
          /* when truncate fails, we can't just append as then we'll
             create something strange, bail out */
          if(!global->mute)
            fprintf(global->errors,
                    "failed to truncate, exiting\n");
          return CURLE_WRITE_ERROR;
        }
        /* now seek to the end of the file, the position where we
           just truncated the file in a large file-safe way */
        rc = fseek(outs->stream, 0, SEEK_END);
#else
        /* ftruncate is not available, so just reposition the file
           to the location we would have truncated it. This won't
           work properly with large files on 32-bit systems, but
           most of those will have ftruncate. */
        rc = fseek(outs->stream, (long)outs->init, SEEK_SET);
#endif
        if(rc) {
          if(!global->mute)
            fprintf(global->errors,
                    "failed seeking to end of file, exiting\n");
          return CURLE_WRITE_ERROR;
        }
        outs->bytes = 0; /* clear for next round */
      }
      *retryp = TRUE; /* curl_easy_perform loop */
      return CURLE_OK;
    }
  } /* if retry_numretries */
  else if(per->metalink) {
    /* Metalink: Decide to try the next resource or not. Try the next resource
       if download was not successful. */
    long response;
    if(CURLE_OK == result) {
      /* TODO We want to try next resource when download was
         not successful. How to know that? */
      char *effective_url = NULL;
      curl_easy_getinfo(curl, CURLINFO_EFFECTIVE_URL, &effective_url);
      if(effective_url &&
         curl_strnequal(effective_url, "http", 4)) {
        /* This was HTTP(S) */
        curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &response);
        if(response != 200 && response != 206) {
          per->metalink_next_res = 1;
          fprintf(global->errors,
                  "Metalink: fetching (%s) from (%s) FAILED "
                  "(HTTP status code %ld)\n",
                  per->mlfile->filename, per->this_url, response);
        }
      }
    }
    else {
      per->metalink_next_res = 1;
      fprintf(global->errors,
              "Metalink: fetching (%s) from (%s) FAILED (%s)\n",
              per->mlfile->filename, per->this_url,
              curl_easy_strerror(result));
    }
  }

  if((global->progressmode == CURL_PROGRESS_BAR) &&
     per->progressbar.calls)
    /* if the custom progress bar has been displayed, we output a
       newline here */
    fputs("\n", per->progressbar.out);

  if(config->writeout)
    ourWriteOut(per->curl, &per->outs, config->writeout);

  /* Close the outs file */
  if(outs->fopened && outs->stream) {
    int rc = fclose(outs->stream);
    if(!result && rc) {
      /* something went wrong in the writing process */
      result = CURLE_WRITE_ERROR;
      fprintf(global->errors, "(%d) Failed writing body\n", result);
    }
  }

  /* File time can only be set _after_ the file has been closed */
  if(!result && config->remote_time && outs->s_isreg && outs->filename) {
    /* Ask libcurl if we got a remote file time */
    curl_off_t filetime = -1;
    curl_easy_getinfo(curl, CURLINFO_FILETIME_T, &filetime);
    setfiletime(filetime, outs->filename, config->global->errors);
  }

  /* Close function-local opened file descriptors */
  if(per->heads.fopened && per->heads.stream)
    fclose(per->heads.stream);

  if(per->heads.alloc_filename)
    Curl_safefree(per->heads.filename);

  if(per->etag_save.fopened && per->etag_save.stream)
    fclose(per->etag_save.stream);

  if(per->etag_save.alloc_filename)
    Curl_safefree(per->etag_save.filename);

  curl_easy_cleanup(per->curl);
  if(outs->alloc_filename)
    free(outs->filename);
  free(per->this_url);
  free(per->separator_err);
  free(per->separator);
  free(per->outfile);
  free(per->uploadfile);

  return CURLE_OK;
}